

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O3

void __thiscall QMakeEvaluator::evaluateCommand(QMakeEvaluator *this,QString *cmds,QString *where)

{
  QStack<QMakeEvaluator::Location> *this_00;
  qsizetype *pqVar1;
  ushort uVar2;
  long lVar3;
  ProFile *pPVar4;
  ProFile *this_01;
  iterator iVar5;
  char16_t *tokPtr;
  QStringView contents;
  
  lVar3 = (cmds->d).size;
  if (lVar3 != 0) {
    contents.m_data = (cmds->d).ptr;
    contents.m_size = lVar3;
    this_01 = QMakeParser::parsedProBlock(this->m_parser,contents,0,where,-1,FullGrammar);
    if (this_01->m_ok == true) {
      this_00 = &this->m_locationStack;
      QtPrivate::QPodArrayOps<QMakeEvaluator::Location>::emplace<QMakeEvaluator::Location_const&>
                ((QPodArrayOps<QMakeEvaluator::Location> *)this_00,
                 (this->m_locationStack).super_QList<QMakeEvaluator::Location>.d.size,
                 &this->m_current);
      QList<QMakeEvaluator::Location>::end(&this_00->super_QList<QMakeEvaluator::Location>);
      tokPtr = (this_01->m_proitems).d.ptr;
      if (tokPtr == (char16_t *)0x0) {
        tokPtr = (char16_t *)&QString::_empty;
      }
      (this->m_current).pro = this_01;
      (this->m_current).line = 0;
      visitProBlock(this,(ushort *)tokPtr);
      iVar5 = QList<QMakeEvaluator::Location>::end(&this_00->super_QList<QMakeEvaluator::Location>);
      pPVar4 = iVar5.i[-1].pro;
      uVar2 = iVar5.i[-1].line;
      pqVar1 = &(this->m_locationStack).super_QList<QMakeEvaluator::Location>.d.size;
      *pqVar1 = *pqVar1 + -1;
      (this->m_current).pro = pPVar4;
      (this->m_current).line = uVar2;
    }
    ProFile::deref(this_01);
    return;
  }
  return;
}

Assistant:

void QMakeEvaluator::evaluateCommand(const QString &cmds, const QString &where)
{
    if (!cmds.isEmpty()) {
        ProFile *pro = m_parser->parsedProBlock(QStringView(cmds), 0, where, -1);
        if (pro->isOk()) {
            m_locationStack.push(m_current);
            visitProBlock(pro, pro->tokPtr());
            m_current = m_locationStack.pop();
        }
        pro->deref();
    }
}